

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa_common.h
# Opt level: O1

void init_alsa_device(int argc,char **argv,size_t default_period_size,size_t default_buffer_size,
                     int mode,snd_pcm_t **out_device,size_t *out_period_size,uint *out_rate,
                     snd_pcm_format_t *out_format)

{
  float fVar1;
  undefined1 *alsabuffer;
  snd_pcm_t *psVar2;
  size_t sVar3;
  uint32_t rate;
  xm_context_t *pxVar4;
  bool bVar5;
  byte bVar6;
  uint8_t uVar7;
  _Bool _Var8;
  uint16_t uVar9;
  uint16_t uVar10;
  ushort channel;
  int iVar11;
  uint extraout_EAX;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  undefined4 extraout_var;
  time_t tVar16;
  size_t __len;
  char *pcVar17;
  float *pfVar18;
  char *pcVar19;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar20;
  ulong uVar21;
  char cVar22;
  char *pcVar23;
  ulong uVar24;
  float *pfVar25;
  snd_pcm_format_t sVar26;
  ulong unaff_RBP;
  long lVar27;
  char **ppcVar28;
  ulong uVar29;
  undefined2 uVar30;
  undefined4 in_register_00000084;
  ulong uVar31;
  char **unaff_R13;
  char *unaff_R14;
  ulong unaff_R15;
  long lVar32;
  bool bVar33;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar34;
  size_t period_size;
  size_t buffer_size;
  ulong auStackY_260 [7];
  undefined8 uStack_210;
  float fStack_208;
  undefined2 uStack_203;
  undefined4 uStack_201;
  undefined2 uStack_1fd;
  size_t sStack_1b8;
  ulong uStack_1b0;
  long lStack_1a8;
  ulong uStack_1a0;
  ulong uStack_198;
  ulong uStack_190;
  undefined1 *puStack_188;
  ulong uStack_180;
  undefined1 *puStack_178;
  snd_pcm_t *psStack_170;
  size_t sStack_168;
  float *pfStack_160;
  ulong uStack_158;
  snd_pcm_format_t sStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint uStack_140;
  float fStack_13c;
  float fStack_138;
  snd_pcm_format_t sStack_134;
  snd_pcm_t *psStack_130;
  ulong uStack_128;
  char **ppcStack_120;
  uint64_t uStack_118;
  ulong uStack_110;
  ulong uStack_108;
  uint32_t uStack_fc;
  ulong uStack_f8;
  ushort uStack_f0;
  ushort uStack_ee;
  float fStack_ec;
  ulong uStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  uint16_t uStack_ca;
  uint uStack_c8;
  byte bStack_c2;
  byte bStack_c1;
  xm_context_t *pxStack_c0;
  byte bStack_b1;
  ulong uStack_b0;
  char *pcStack_a8;
  char **ppcStack_a0;
  char *pcStack_98;
  ulong uStack_90;
  code *pcStack_88;
  code *pcStack_80;
  snd_pcm_t *local_70;
  undefined8 local_68;
  uint local_5c;
  size_t local_58;
  size_t local_50;
  char **local_48;
  uint local_3c;
  snd_pcm_t **local_38;
  
  lVar32 = CONCAT44(in_register_00000084,mode);
  local_58 = default_period_size;
  local_50 = default_buffer_size;
  local_3c = mode;
  local_38 = out_device;
  if ((uint)argc < 2) {
    local_5c = 0xe;
    local_48 = (char **)0xbb80;
    pcVar23 = "default";
    argv = unaff_R13;
  }
  else {
    unaff_RBP = (ulong)argc;
    pcVar23 = "default";
    local_48 = (char **)0xbb80;
    local_5c = 0xe;
    unaff_R15 = 1;
    do {
      unaff_R14 = argv[unaff_R15];
      pcStack_80 = (code *)0x103110;
      iVar11 = strcmp(unaff_R14,"--");
      if (iVar11 == 0) break;
      pcStack_80 = (code *)0x103127;
      iVar11 = strcmp(unaff_R14,"--device");
      if (iVar11 == 0) {
        if (unaff_R15 + 1 == unaff_RBP) {
          pcStack_80 = (code *)0x103677;
          init_alsa_device_cold_6();
LAB_00103677:
          pcStack_80 = (code *)0x103682;
          init_alsa_device_cold_5();
LAB_00103682:
          pcStack_80 = (code *)0x10368d;
          init_alsa_device_cold_2();
LAB_0010368d:
          pcStack_80 = (code *)0x103698;
          init_alsa_device_cold_4();
LAB_00103698:
          pcStack_80 = (code *)0x1036a3;
          init_alsa_device_cold_3();
LAB_001036a3:
          pcStack_80 = (code *)0x1036ae;
          pcVar17 = unaff_R14;
          init_alsa_device_cold_1();
          iVar11 = (int)pcVar17;
          pcVar17 = (char *)(unaff_R15 + 1);
          goto LAB_001036ae;
        }
        pcVar23 = argv[unaff_R15 + 1];
      }
      else {
        pcStack_80 = (code *)0x10313e;
        iVar11 = strcmp(unaff_R14,"--buffer-size");
        if (iVar11 == 0) {
          if (unaff_R15 + 1 == unaff_RBP) goto LAB_00103677;
          pcStack_80 = (code *)0x10321e;
          local_50 = strtol(argv[unaff_R15 + 1],(char **)0x0,0);
        }
        else {
          pcStack_80 = (code *)0x103155;
          iVar11 = strcmp(unaff_R14,"--period-size");
          if (iVar11 == 0) {
            if (unaff_R15 + 1 != unaff_RBP) {
              pcStack_80 = (code *)0x103240;
              local_58 = strtol(argv[unaff_R15 + 1],(char **)0x0,0);
              goto LAB_0010327b;
            }
            goto LAB_0010368d;
          }
          pcStack_80 = (code *)0x10316c;
          iVar11 = strcmp(unaff_R14,"--rate");
          if (iVar11 == 0) {
            if (unaff_R15 + 1 != unaff_RBP) {
              pcStack_80 = (code *)0x103262;
              local_48 = (char **)strtol(argv[unaff_R15 + 1],(char **)0x0,0);
              goto LAB_0010327b;
            }
            goto LAB_00103698;
          }
          pcStack_80 = (code *)0x103183;
          iVar11 = strcmp(unaff_R14,"--format");
          if (iVar11 != 0) break;
          if (unaff_R15 + 1 == unaff_RBP) goto LAB_00103682;
          unaff_R14 = argv[unaff_R15 + 1];
          pcStack_80 = (code *)0x1031ac;
          iVar11 = strcmp(unaff_R14,"float");
          if (iVar11 == 0) {
            local_5c = 0xe;
          }
          else {
            pcStack_80 = (code *)0x1031c3;
            iVar11 = strcmp(unaff_R14,"s16");
            if (iVar11 == 0) {
              local_5c = 2;
            }
            else {
              pcStack_80 = (code *)0x1031da;
              iVar11 = strcmp(unaff_R14,"s32");
              local_5c = 10;
              if (iVar11 != 0) goto LAB_001036a3;
            }
          }
        }
      }
LAB_0010327b:
      unaff_R15 = unaff_R15 + 2;
    } while (unaff_R15 < unaff_RBP);
  }
  default_buffer_size = (size_t)local_3c;
  pcStack_80 = (code *)0x1032bb;
  iVar11 = snd_pcm_open(&local_70,pcVar23,0);
  pcVar17 = pcVar23;
  if (iVar11 < 0) {
    pcStack_80 = (code *)0x1032cd;
    iVar12 = snd_pcm_recover(local_70,iVar11,0);
    if (-1 < iVar12) goto LAB_001032d5;
LAB_001036ae:
    pcStack_80 = (code *)0x1036b5;
    init_alsa_device_cold_21();
LAB_001036b5:
    pcStack_80 = (code *)0x1036bc;
    init_alsa_device_cold_20();
LAB_001036bc:
    pcStack_80 = (code *)0x1036c3;
    init_alsa_device_cold_19();
LAB_001036c3:
    pcStack_80 = (code *)0x1036ca;
    init_alsa_device_cold_18();
LAB_001036ca:
    pcStack_80 = (code *)0x1036d1;
    init_alsa_device_cold_15();
LAB_001036d1:
    pcStack_80 = (code *)0x1036d8;
    init_alsa_device_cold_14();
LAB_001036d8:
    pcStack_80 = (code *)0x1036df;
    init_alsa_device_cold_13();
    pcVar19 = pcVar23;
    pcVar23 = pcVar17;
LAB_001036df:
    pcStack_80 = (code *)0x1036e6;
    init_alsa_device_cold_12();
LAB_001036e6:
    pcStack_80 = (code *)0x1036ed;
    init_alsa_device_cold_11();
LAB_001036ed:
    pcStack_80 = (code *)0x1036f4;
    init_alsa_device_cold_10();
LAB_001036f4:
    pcStack_80 = (code *)0x1036fb;
    init_alsa_device_cold_9();
LAB_001036fb:
    pcStack_80 = (code *)0x103702;
    init_alsa_device_cold_8();
    pcVar17 = pcVar23;
LAB_00103702:
    pcStack_80 = (code *)0x103709;
    init_alsa_device_cold_7();
    pcVar23 = pcVar19;
LAB_00103709:
    pcStack_80 = (code *)0x103710;
    init_alsa_device_cold_16();
    uVar13 = extraout_EAX;
  }
  else {
LAB_001032d5:
    pcStack_80 = (code *)0x1032df;
    iVar11 = snd_pcm_hw_params_malloc(&local_68);
    argv = local_48;
    unaff_RBP = (ulong)local_5c;
    if (iVar11 < 0) {
      pcStack_80 = (code *)0x1032fa;
      iVar12 = snd_pcm_recover(local_70,iVar11,0);
      if (iVar12 < 0) goto LAB_001036b5;
    }
    pcStack_80 = (code *)0x103311;
    iVar11 = snd_pcm_hw_params_any(local_70,local_68);
    if (iVar11 < 0) {
      pcStack_80 = (code *)0x103323;
      iVar12 = snd_pcm_recover(local_70,iVar11,0);
      if (iVar12 < 0) goto LAB_001036bc;
    }
    pcStack_80 = (code *)0x10333f;
    iVar11 = snd_pcm_hw_params_set_access(local_70,local_68,3);
    if (iVar11 < 0) {
      pcStack_80 = (code *)0x103351;
      iVar12 = snd_pcm_recover(local_70,iVar11,0);
      if (iVar12 < 0) goto LAB_001036c3;
    }
    pcStack_80 = (code *)0x10336a;
    iVar11 = snd_pcm_hw_params_set_format(local_70,local_68,unaff_RBP);
    if (-1 < iVar11) {
LAB_001033db:
      default_buffer_size = 0;
      pcStack_80 = (code *)0x1033ef;
      iVar11 = snd_pcm_hw_params_set_rate(local_70,local_68,(ulong)argv & 0xffffffff);
      if (-1 < iVar11) {
LAB_00103449:
        pcStack_80 = (code *)0x10345d;
        iVar11 = snd_pcm_hw_params_set_channels(local_70,local_68,2);
        if (iVar11 < 0) {
          pcStack_80 = (code *)0x10346f;
          iVar12 = snd_pcm_recover(local_70,iVar11,0);
          if (iVar12 < 0) goto LAB_001036ca;
        }
        pcStack_80 = (code *)0x10348b;
        iVar11 = snd_pcm_hw_params_set_buffer_size_near(local_70,local_68,&local_50);
        if (iVar11 < 0) {
          pcStack_80 = (code *)0x10349d;
          iVar12 = snd_pcm_recover(local_70,iVar11,0);
          if (iVar12 < 0) goto LAB_001036d1;
        }
        default_buffer_size = 0;
        pcStack_80 = (code *)0x1034bb;
        iVar11 = snd_pcm_hw_params_set_period_size_near(local_70,local_68,&local_58);
        if (iVar11 < 0) {
          pcStack_80 = (code *)0x1034cd;
          iVar12 = snd_pcm_recover(local_70,iVar11,0);
          if (iVar12 < 0) goto LAB_001036d8;
        }
        pcStack_80 = (code *)0x1034e4;
        iVar11 = snd_pcm_hw_params(local_70,local_68);
        if (iVar11 < 0) {
          pcStack_80 = (code *)0x1034f6;
          iVar12 = snd_pcm_recover(local_70,iVar11,0);
          pcVar19 = pcVar23;
          if (iVar12 < 0) goto LAB_001036df;
        }
        pcVar19 = (char *)&local_68;
        pcStack_80 = (code *)0x10350b;
        snd_pcm_hw_params_free(local_68);
        pcStack_80 = (code *)0x103513;
        iVar11 = snd_pcm_sw_params_malloc(pcVar19);
        if (iVar11 < 0) {
          pcStack_80 = (code *)0x103525;
          iVar12 = snd_pcm_recover(local_70,iVar11,0);
          if (iVar12 < 0) goto LAB_001036e6;
        }
        pcStack_80 = (code *)0x10353c;
        iVar11 = snd_pcm_sw_params_current(local_70,local_68);
        if (iVar11 < 0) {
          pcStack_80 = (code *)0x10354e;
          iVar12 = snd_pcm_recover(local_70,iVar11,0);
          if (iVar12 < 0) goto LAB_001036ed;
        }
        pcStack_80 = (code *)0x10356f;
        iVar11 = snd_pcm_sw_params_set_start_threshold(local_70,local_68,local_50 - local_58);
        if (iVar11 < 0) {
          pcStack_80 = (code *)0x103581;
          iVar12 = snd_pcm_recover(local_70,iVar11,0);
          if (iVar12 < 0) goto LAB_001036f4;
        }
        pcStack_80 = (code *)0x10359d;
        iVar11 = snd_pcm_sw_params_set_avail_min(local_70,local_68,local_58);
        if (iVar11 < 0) {
          pcStack_80 = (code *)0x1035af;
          iVar12 = snd_pcm_recover(local_70,iVar11,0);
          if (iVar12 < 0) goto LAB_001036fb;
        }
        pcStack_80 = (code *)0x1035c6;
        iVar11 = snd_pcm_sw_params(local_70,local_68);
        if (-1 < iVar11) {
LAB_001035e0:
          pcStack_80 = (code *)0x103602;
          snd_pcm_sw_params_free(local_68);
          sVar26 = (snd_pcm_format_t)unaff_RBP;
          pcVar17 = "s16";
          if (sVar26 == SND_PCM_FORMAT_S32) {
            pcVar17 = "s32";
          }
          pcVar19 = "float";
          if (sVar26 != SND_PCM_FORMAT_FLOAT) {
            pcVar19 = pcVar17;
          }
          pcStack_80 = (code *)0x103643;
          printf("Opened ALSA device: %s, %s, %i Hz, %lu/%lu\n",pcVar23,pcVar19,
                 (ulong)argv & 0xffffffff,local_58,local_50);
          *local_38 = local_70;
          *out_period_size = local_58;
          *out_rate = (uint)argv;
          *out_format = sVar26;
          return;
        }
        pcStack_80 = (code *)0x1035d8;
        iVar12 = snd_pcm_recover(local_70,iVar11,0);
        if (-1 < iVar12) goto LAB_001035e0;
        goto LAB_00103702;
      }
      argv = (char **)0xbb80;
      default_buffer_size = 0;
      pcStack_80 = (code *)0x10340f;
      iVar11 = snd_pcm_hw_params_set_rate(local_70,local_68,48000);
      if (-1 < iVar11) goto LAB_00103449;
      argv = (char **)0xac44;
      default_buffer_size = 0;
      pcStack_80 = (code *)0x10342f;
      iVar11 = snd_pcm_hw_params_set_rate(local_70,local_68,0xac44);
      if (-1 < iVar11) goto LAB_00103449;
      pcStack_80 = (code *)0x103441;
      iVar12 = snd_pcm_recover(local_70,iVar11,0);
      if (-1 < iVar12) goto LAB_00103449;
      goto LAB_00103709;
    }
    unaff_RBP = 0xe;
    pcStack_80 = (code *)0x103387;
    iVar11 = snd_pcm_hw_params_set_format(local_70,local_68,0xe);
    if (-1 < iVar11) goto LAB_001033db;
    unaff_RBP = 10;
    pcStack_80 = (code *)0x1033a4;
    iVar11 = snd_pcm_hw_params_set_format(local_70,local_68,10);
    if (-1 < iVar11) goto LAB_001033db;
    unaff_RBP = 2;
    pcStack_80 = (code *)0x1033c1;
    iVar11 = snd_pcm_hw_params_set_format(local_70,local_68,2);
    if (-1 < iVar11) goto LAB_001033db;
    pcStack_80 = (code *)0x1033d3;
    uVar13 = snd_pcm_recover(local_70,iVar11,0);
    if (-1 < (int)uVar13) goto LAB_001033db;
  }
  uVar15 = (ulong)uVar13;
  pcStack_80 = play_floatbuffer;
  init_alsa_device_cold_17();
  lVar20 = extraout_RDX;
  fVar34 = extraout_XMM0_Da;
  pcStack_80 = (code *)pcVar23;
  if (((iVar11 == 0xe) && (extraout_XMM0_Da == 1.0)) && (!NAN(extraout_XMM0_Da))) {
    pcStack_88 = (code *)0x103736;
    iVar11 = snd_pcm_writei(uVar15,default_buffer_size);
    if (-1 < iVar11) {
      return;
    }
    pcStack_88 = (code *)0x10374a;
    iVar12 = snd_pcm_recover(uVar15,iVar11,0);
    if (-1 < iVar12) {
      return;
    }
    pcStack_88 = (code *)0x103759;
    play_floatbuffer_cold_2();
    lVar20 = extraout_RDX_00;
    fVar34 = extraout_XMM0_Da_00;
  }
  if (iVar11 == 2) {
    if (lVar20 * 2 != 0) {
      lVar27 = 0;
      do {
        fVar1 = *(float *)(default_buffer_size + lVar27 * 4) * fVar34;
        uVar30 = 0x7fff;
        if ((fVar1 <= 1.0) && (uVar30 = 0x8001, -1.0 <= fVar1)) {
          uVar30 = (undefined2)(int)(fVar1 * 32767.0);
        }
        *(undefined2 *)(lVar32 + lVar27 * 2) = uVar30;
        lVar27 = lVar27 + 1;
      } while (lVar20 * 2 != lVar27);
    }
  }
  else if (iVar11 == 10) {
    if (lVar20 * 2 != 0) {
      lVar27 = 0;
      do {
        fVar1 = *(float *)(default_buffer_size + lVar27 * 4) * fVar34;
        iVar11 = 0x7fffffff;
        if ((fVar1 <= 1.0) && (iVar11 = -0x7fffffff, -1.0 <= fVar1)) {
          iVar11 = (int)(fVar1 * 2.1474836e+09);
        }
        *(int *)(lVar32 + lVar27 * 4) = iVar11;
        lVar27 = lVar27 + 1;
      } while (lVar20 * 2 != lVar27);
    }
  }
  else if ((iVar11 == 0xe) && (lVar20 * 2 != 0)) {
    lVar27 = 0;
    do {
      *(float *)(lVar32 + lVar27 * 4) = *(float *)(default_buffer_size + lVar27 * 4) * fVar34;
      lVar27 = lVar27 + 1;
    } while (lVar20 * 2 != lVar27);
  }
  pcStack_88 = (code *)0x10385a;
  uVar13 = snd_pcm_writei(uVar15,lVar32);
  if (-1 < (int)uVar13) {
    return;
  }
  ppcVar28 = (char **)(ulong)uVar13;
  pcStack_88 = (code *)0x10386a;
  uVar13 = snd_pcm_recover(uVar15,ppcVar28,0);
  if (-1 < (int)uVar13) {
    return;
  }
  pcStack_88 = main;
  play_floatbuffer_cold_1();
  pfVar18 = &fStack_208;
  uStack_118 = 0;
  pfVar25 = &fStack_208;
  uStack_b0 = uVar15;
  pcStack_a8 = pcVar17;
  ppcStack_a0 = argv;
  pcStack_98 = unaff_R14;
  uStack_90 = unaff_R15;
  pcStack_88 = (code *)unaff_RBP;
  if (uVar13 != 1) {
    pcVar23 = ppcVar28[1];
    uStack_210 = 0x1038b8;
    iVar11 = strcmp(pcVar23,"-h");
    pfVar25 = &fStack_208;
    if (iVar11 != 0) {
      uStack_210 = 0x1038cf;
      iVar11 = strcmp(pcVar23,"--help");
      pfVar25 = &fStack_208;
      if (iVar11 != 0) {
        uStack_f8 = (ulong)(int)uVar13;
        ppcStack_120 = ppcVar28;
        uStack_e8 = (ulong)uVar13;
        if (uVar13 == 0) {
          fStack_ec = 1.0;
          uStack_d8 = 1;
          uVar15 = 1;
          uVar24 = 0;
        }
        else {
          uVar15 = 1;
          uStack_d8 = 1;
          fStack_ec = 1.0;
          uStack_e0 = 0;
          do {
            pcVar23 = ppcVar28[uVar15];
            uStack_210 = 0x103930;
            iVar11 = strcmp(pcVar23,"--");
            if (iVar11 == 0) {
              uVar15 = uVar15 + 1;
              uVar24 = uStack_e0;
              goto LAB_00103a6d;
            }
            uStack_210 = 0x103943;
            iVar11 = strcmp(pcVar23,"--preamp");
            if (iVar11 == 0) {
              uVar24 = uVar15 + 1;
              if (uVar24 == uStack_f8) goto LAB_00104485;
              uStack_210 = 0x1039fd;
              fStack_ec = strtof(ppcVar28[uVar15 + 1],(char **)0x0);
            }
            else {
              uStack_210 = 0x10395a;
              iVar11 = strcmp(pcVar23,"--loop");
              if (iVar11 == 0) {
                uVar24 = uVar15 + 1;
                pfVar25 = &fStack_208;
                if (uVar24 == uStack_f8) goto LAB_00104498;
                uStack_210 = 0x103a22;
                uStack_d8 = strtol(ppcVar28[uVar15 + 1],(char **)0x0,0);
              }
              else {
                uStack_210 = 0x103971;
                iVar11 = strcmp(pcVar23,"--random");
                if (iVar11 == 0) {
                  uStack_e0 = CONCAT71((int7)(CONCAT44(extraout_var,iVar11) >> 8),1);
                  uVar24 = uVar15;
                }
                else {
                  uStack_210 = 0x103988;
                  iVar11 = strcmp(pcVar23,"--device");
                  if (iVar11 != 0) {
                    uStack_210 = 0x10399b;
                    iVar11 = strcmp(pcVar23,"--buffer-size");
                    if (iVar11 != 0) {
                      uStack_210 = 0x1039ae;
                      iVar11 = strcmp(pcVar23,"--period-size");
                      if (iVar11 != 0) {
                        uStack_210 = 0x1039c1;
                        iVar11 = strcmp(pcVar23,"--rate");
                        if (iVar11 != 0) {
                          uStack_210 = 0x1039d4;
                          iVar11 = strcmp(pcVar23,"--format");
                          uVar24 = uStack_e0;
                          if (iVar11 != 0) goto LAB_00103a6d;
                        }
                      }
                    }
                  }
                  uVar24 = uVar15 + 1;
                }
              }
            }
            uVar15 = uVar24 + 1;
          } while (uVar15 < uStack_f8);
          uVar15 = 1;
          uVar24 = uStack_e0;
        }
LAB_00103a6d:
        ppcVar28 = ppcStack_120;
        uStack_108 = uVar15;
        if ((uVar24 & 1) != 0) {
          uStack_210 = 0x103a83;
          tVar16 = time((time_t *)0x0);
          uStack_210 = 0x103a8a;
          srand((uint)tVar16);
          uVar15 = uStack_108;
          uVar24 = (ulong)((int)uStack_e8 + -1);
          if (uStack_108 < uVar24) {
            lVar32 = 1 - uStack_108;
            do {
              uStack_210 = 0x103ab2;
              iVar11 = rand();
              uVar21 = (ulong)(long)iVar11 % (lVar32 + uVar24);
              pcVar23 = ppcVar28[uVar24];
              ppcVar28[uVar24] = ppcVar28[uVar15 + uVar21];
              ppcVar28[uVar15 + uVar21] = pcVar23;
              uVar24 = uVar24 - 1;
            } while (uVar15 < uVar24);
          }
        }
        auStackY_260[6] = 0x103b0f;
        init_alsa_device((int)uStack_e8,ppcVar28,0x80,0x400,0,&psStack_170,&sStack_1b8,&uStack_fc,
                         &sStack_150);
        uVar24 = sStack_1b8 * 8 + 0xf & 0xfffffffffffffff0;
        pfStack_160 = (float *)((long)&fStack_208 - uVar24);
        pfVar18 = (float *)((long)pfStack_160 - uVar24);
        puStack_188 = (undefined1 *)pfVar18;
        puStack_178 = (undefined1 *)&fStack_208;
        *(undefined8 *)((long)pfVar18 + -8) = 0x103b57;
        tcgetattr(0,(termios *)&previousflags);
        *(undefined8 *)((long)pfVar18 + -8) = 0x103b63;
        atexit(restoreterm);
        customflags.c_iflag = previousflags.c_iflag;
        customflags.c_oflag = previousflags.c_oflag;
        customflags.c_line = previousflags.c_line;
        customflags.c_cc[0] = previousflags.c_cc[0];
        customflags.c_cc[1] = previousflags.c_cc[1];
        customflags.c_cc[2] = previousflags.c_cc[2];
        customflags.c_cc[3] = previousflags.c_cc[3];
        customflags.c_cc[4] = previousflags.c_cc[4];
        customflags.c_cc[5] = previousflags.c_cc[5];
        customflags.c_cc[6] = previousflags.c_cc[6];
        customflags.c_cc[7] = previousflags.c_cc[7];
        customflags.c_cc[8] = previousflags.c_cc[8];
        customflags.c_cc[9] = previousflags.c_cc[9];
        customflags.c_cc[10] = previousflags.c_cc[10];
        customflags.c_cc[0xb] = previousflags.c_cc[0xb];
        customflags.c_cc[0xc] = previousflags.c_cc[0xc];
        customflags.c_cc[0xd] = previousflags.c_cc[0xd];
        customflags.c_cc[0xe] = previousflags.c_cc[0xe];
        customflags.c_cc[0xf] = previousflags.c_cc[0xf];
        customflags.c_cc[0x10] = previousflags.c_cc[0x10];
        customflags.c_cc[0x11] = previousflags.c_cc[0x11];
        customflags.c_cc[0x12] = previousflags.c_cc[0x12];
        customflags.c_cc[0x13] = previousflags.c_cc[0x13];
        customflags.c_cc[0x14] = previousflags.c_cc[0x14];
        customflags.c_cc[0x15] = previousflags.c_cc[0x15];
        customflags.c_cc[0x16] = previousflags.c_cc[0x16];
        customflags.c_cc[0x17] = previousflags.c_cc[0x17];
        customflags.c_cc[0x18] = previousflags.c_cc[0x18];
        customflags.c_cc[0x19] = previousflags.c_cc[0x19];
        customflags.c_cc[0x1a] = previousflags.c_cc[0x1a];
        customflags.c_cc[0x1b] = previousflags.c_cc[0x1b];
        customflags.c_cc[0x1c] = previousflags.c_cc[0x1c];
        customflags.c_cc[0x1d] = previousflags.c_cc[0x1d];
        customflags.c_cc[0x1e] = previousflags.c_cc[0x1e];
        customflags.c_cc[0x1f] = previousflags.c_cc[0x1f];
        customflags._49_3_ = previousflags._49_3_;
        customflags.c_ispeed = previousflags.c_ispeed;
        customflags.c_ospeed = previousflags.c_ospeed;
        customflags._8_8_ = previousflags._8_8_ & 0xffffffb5ffffffff | 0x4000000000;
        *(undefined8 *)((long)pfVar18 + -8) = 0x103bbd;
        tcsetattr(0,0,(termios *)&customflags);
        if (uVar15 < uStack_f8) {
          uStack_e8 = 0;
          uStack_c8 = 0;
          uStack_110 = 0;
          uVar15 = uStack_108;
LAB_00103be5:
          rate = uStack_fc;
          bStack_b1 = 0;
          pcVar23 = ppcStack_120[uVar15];
          *(undefined8 *)((long)pfVar18 + -8) = 0x103c01;
          iVar11 = open(pcVar23,0);
          if (iVar11 != -1) {
            *(undefined8 *)((long)pfVar18 + -8) = 0x103c1a;
            __len = lseek(iVar11,0,2);
            if (__len == 0xffffffffffffffff) {
              *(undefined8 *)((long)pfVar18 + -8) = 0x1043ff;
              main_cold_7();
              goto LAB_00103c7a;
            }
            *(undefined8 *)((long)pfVar18 + -8) = 0x103c41;
            pcVar23 = (char *)mmap((void *)0x0,__len,1,1,iVar11,0);
            if (pcVar23 != (char *)0xffffffffffffffff) {
              *(undefined8 *)((long)pfVar18 + -8) = 0x103c60;
              iVar12 = xm_create_context_safe(&pxStack_c0,pcVar23,__len,rate);
              if (iVar12 != 0) {
                if (iVar12 != 1) {
                  if (iVar12 == 2) {
                    *(undefined8 *)((long)pfVar18 + -8) = 0x10446d;
                    main_cold_3();
                    goto LAB_0010446d;
                  }
                  goto LAB_00104472;
                }
                *(undefined8 *)((long)pfVar18 + -8) = 0x104412;
                main_cold_4();
              }
              *(undefined8 *)((long)pfVar18 + -8) = 0x103c73;
              munmap(pcVar23,__len);
              *(undefined8 *)((long)pfVar18 + -8) = 0x103c7a;
              close(iVar11);
              goto LAB_00103c7a;
            }
LAB_0010446d:
            *(undefined8 *)((long)pfVar18 + -8) = 0x104472;
            main_cold_6();
LAB_00104472:
            *(undefined8 *)((long)pfVar18 + -8) = 0x104477;
            main_cold_5();
            goto LAB_00104477;
          }
          *(undefined8 *)((long)pfVar18 + -8) = 0x1043e5;
          main_cold_8();
LAB_00103c7a:
          pxVar4 = pxStack_c0;
          if (pxStack_c0 != (xm_context_t *)0x0) {
            uVar7 = (uint8_t)uStack_d8;
            uStack_128 = uVar15;
            *(undefined8 *)((long)pfVar18 + -8) = 0x103ca2;
            xm_set_max_loop_count(pxVar4,uVar7);
            pxVar4 = pxStack_c0;
            *(undefined8 *)((long)pfVar18 + -8) = 0x103cab;
            uVar9 = xm_get_number_of_patterns(pxVar4);
            pxVar4 = pxStack_c0;
            *(undefined8 *)((long)pfVar18 + -8) = 0x103cb6;
            uVar10 = xm_get_number_of_channels(pxVar4);
            pxVar4 = pxStack_c0;
            uStack_e0 = CONCAT62(uStack_e0._2_6_,uVar10);
            *(undefined8 *)((long)pfVar18 + -8) = 0x103cc3;
            uStack_ca = xm_get_module_length(pxVar4);
            pxVar4 = pxStack_c0;
            *(undefined8 *)((long)pfVar18 + -8) = 0x103cd0;
            xm_get_module_name(pxVar4);
            pxVar4 = pxStack_c0;
            *(undefined8 *)((long)pfVar18 + -8) = 0x103cdc;
            pcVar23 = xm_get_tracker_name(pxVar4);
            *(undefined8 *)((long)pfVar18 + -8) = 0x103cf8;
            printf("==> Playing: %s\n");
            if (pcVar23 != (char *)0x0) {
              *(undefined8 *)((long)pfVar18 + -8) = 0x103d0e;
              printf("==> Tracker: %s\n");
            }
            psVar2 = psStack_170;
            *(undefined8 *)((long)pfVar18 + -8) = 0x103d1d;
            iVar11 = snd_pcm_prepare(psVar2);
            uVar15 = uStack_d8;
            if (-1 < iVar11) {
LAB_00103d40:
              psStack_130 = psVar2;
              uStack_180 = uStack_e0 & 0xffff;
              uStack_158 = (ulong)uStack_fc;
              uStack_140 = (uint)uStack_ca;
              uStack_1a0 = (ulong)(uStack_fc * 0xe10);
              fStack_13c = (float)uStack_1a0;
              uStack_198 = (ulong)uVar9;
              fStack_138 = (float)uStack_158;
              uStack_190 = (ulong)(uStack_fc * 0x3c);
              sStack_168 = sStack_1b8;
              sStack_134 = sStack_150;
              bVar33 = false;
LAB_00103dc4:
              do {
                bVar5 = bVar33;
                pxVar4 = pxStack_c0;
                if (bVar5) goto LAB_00104388;
                if (uVar15 != 0) {
                  *(undefined8 *)((long)pfVar18 + -8) = 0x103ddd;
                  bVar6 = xm_get_loop_count(pxVar4);
                  if (uVar15 <= bVar6) goto LAB_00104388;
                }
                get_command_f._112_8_ = 0;
                get_command_f._120_8_ = 0;
                get_command_f._96_8_ = 0;
                get_command_f._104_8_ = 0;
                get_command_f._80_8_ = 0;
                get_command_f._88_8_ = 0;
                get_command_f._64_8_ = 0;
                get_command_f._72_8_ = 0;
                get_command_f._48_8_ = 0;
                get_command_f._56_8_ = 0;
                get_command_f._32_8_ = 0;
                get_command_f._40_8_ = 0;
                get_command_f._16_8_ = 0;
                get_command_f._24_8_ = 0;
                get_command_f._0_8_ = 0;
                get_command_f._8_8_ = 0;
                *(undefined8 *)((long)pfVar18 + -8) = 0x103e33;
                iVar12 = fileno(_stdin);
                *(undefined8 *)((long)pfVar18 + -8) = 0x103e55;
                iVar14 = fileno(_stdin);
                iVar11 = iVar14 + 0x3f;
                if (-1 < iVar14) {
                  iVar11 = iVar14;
                }
                *(ulong *)(get_command_f + (long)(iVar11 >> 6) * 8) =
                     *(ulong *)(get_command_f + (long)(iVar11 >> 6) * 8) |
                     1L << ((byte)iVar12 & 0x3f);
                get_command_t._0_8_ = 0;
                get_command_t._8_8_ = 0;
                uVar13 = 0;
                *(undefined8 *)((long)pfVar18 + -8) = 0x103e8c;
                iVar11 = select(1,(fd_set *)get_command_f,(fd_set *)0x0,(fd_set *)0x0,
                                (timeval *)get_command_t);
                if (0 < iVar11) {
                  *(undefined8 *)((long)pfVar18 + -8) = 0x103e95;
                  uVar13 = getchar();
                }
                pxVar4 = pxStack_c0;
                psVar2 = psStack_130;
                cVar22 = (char)uVar13;
                bVar33 = true;
                if (cVar22 != 'n') {
                  uVar13 = uVar13 & 0xff;
                  if (uVar13 < 0x6c) {
                    if (uVar13 == 0x20) {
                      uVar24 = uStack_e8 & 0xffffffff ^ 1;
                      if ((uStack_e8 & 1) == 0) {
                        *(undefined8 *)((long)pfVar18 + -8) = 0x103fb5;
                        iVar11 = snd_pcm_pause(psVar2,1);
                        if (iVar11 < 0) {
                          *(undefined8 *)((long)pfVar18 + -8) = 0x103fc1;
                          iVar11 = snd_pcm_drain(psVar2);
                          if (iVar11 < 0) {
                            *(undefined8 *)((long)pfVar18 + -8) = 0x103fd1;
                            iVar11 = snd_pcm_recover(psVar2,iVar11,0);
                            if (iVar11 < 0) goto LAB_001044aa;
                          }
                        }
                        uStack_1fd = 0x2d;
                        _fStack_208 = 0x4150202d2d;
                        uStack_203 = 0x5355;
                        uStack_201 = 0x2d204445;
                        uStack_110 = 0xffffffffffffffff;
                        uStack_e8 = uVar24;
                      }
                      else {
                        uStack_c8 = (uint)CONCAT71((int7)(uStack_e8 >> 8),1);
                        uStack_110 = 0;
                        uStack_e8 = uVar24;
                      }
                    }
                    else if (uVar13 == 0x3c) {
                      if (bStack_b1 != 0) {
                        if (uVar15 != 0) {
                          *(undefined8 *)((long)pfVar18 + -8) = 0x103f53;
                          xm_set_max_loop_count(pxVar4,'\0');
                        }
                        pxVar4 = pxStack_c0;
                        uVar7 = bStack_b1 - 1;
                        *(undefined8 *)((long)pfVar18 + -8) = 0x103f68;
                        xm_seek(pxVar4,uVar7,'\0',0);
                        uVar15 = 0;
                      }
                    }
                    else {
                      if (uVar13 != 0x3e) goto LAB_00103f94;
                      if (bStack_b1 < uStack_ca) {
                        uVar7 = bStack_b1 + 1;
                        *(undefined8 *)((long)pfVar18 + -8) = 0x103f12;
                        xm_seek(pxVar4,uVar7,'\0',0);
                      }
                    }
                  }
                  else if (uVar13 == 0x6c) {
                    bVar33 = uVar15 == 0;
                    uVar15 = (ulong)bVar33;
                    *(undefined8 *)((long)pfVar18 + -8) = 0x103f83;
                    xm_set_max_loop_count(pxVar4,bVar33);
                  }
                  else {
                    if (uVar13 == 0x70) {
                      if (uStack_128 == uStack_108) {
LAB_0010445c:
                        *(undefined8 *)((long)pfVar18 + -8) = 0x104463;
                        exit(0);
                      }
                      uStack_128 = uStack_128 - 2;
                      bVar33 = true;
                      goto LAB_00103dc4;
                    }
                    if (uVar13 == 0x71) {
                      *(undefined8 *)((long)pfVar18 + -8) = 0x10445c;
                      putchar(10);
                      goto LAB_0010445c;
                    }
LAB_00103f94:
                    if ((byte)(cVar22 - 0x30U) < 10) {
                      channel = (short)uVar13 - 0x2f;
                    }
                    else {
                      if (0x15 < (byte)(cVar22 + 0xbfU)) goto LAB_00104109;
                      channel = (short)uVar13 - 0x36;
                    }
                    if (channel <= (ushort)uStack_e0) {
                      uStack_d8 = uVar15;
                      *(undefined8 *)((long)pfVar18 + -8) = 0x104046;
                      _Var8 = xm_mute_channel(pxVar4,channel,true);
                      *(undefined8 *)((long)pfVar18 + -8) = 0x104056;
                      xm_mute_channel(pxVar4,channel,!_Var8);
                      _fStack_208 = 0x6e6e616843;
                      uStack_203 = 0x6c65;
                      uStack_201 = 0x203a73;
                      if ((ushort)uStack_e0 != 0) {
                        uVar9 = 1;
                        uVar15 = 1;
                        do {
                          pxVar4 = pxStack_c0;
                          *(undefined8 *)((long)pfVar18 + -8) = 0x104097;
                          _Var8 = xm_mute_channel(pxVar4,uVar9,true);
                          pxVar4 = pxStack_c0;
                          *(undefined8 *)((long)pfVar18 + -8) = 0x1040a9;
                          xm_mute_channel(pxVar4,uVar9,_Var8);
                          cVar22 = '.';
                          if (!_Var8) {
                            cVar22 = "Channels: "[(long)(int)uVar15 + 10];
                          }
                          *(char *)((long)&uStack_201 + uVar15 + 2) = cVar22;
                          uVar9 = uVar9 + 1;
                          uVar15 = (ulong)uVar9;
                        } while (uVar9 <= (ushort)uStack_e0);
                      }
                      *(undefined1 *)((long)&uStack_201 + uStack_180 + 3) = 0;
                      uStack_110 = uStack_118 + uStack_158;
                      uVar15 = uStack_d8;
                    }
                  }
LAB_00104109:
                  pxVar4 = pxStack_c0;
                  *(undefined8 *)((long)pfVar18 + -8) = 0x104125;
                  xm_get_position(pxVar4,&bStack_b1,&bStack_c2,&bStack_c1,&uStack_118);
                  pxVar4 = pxStack_c0;
                  *(undefined8 *)((long)pfVar18 + -8) = 0x104136;
                  xm_get_playing_speed(pxVar4,&uStack_f0,&uStack_ee);
                  pxVar4 = pxStack_c0;
                  bVar6 = bStack_c2;
                  if (uStack_110 < uStack_118) {
                    uStack_14c = (uint)uStack_ee;
                    uStack_148 = (uint)uStack_f0;
                    uStack_144 = (uint)bStack_b1;
                    uStack_1b0 = (ulong)bStack_c1;
                    uStack_d8 = uVar15;
                    *(undefined8 *)((long)pfVar18 + -8) = 0x104184;
                    uVar9 = xm_get_number_of_rows(pxVar4,(ushort)bVar6);
                    pxVar4 = pxStack_c0;
                    *(undefined8 *)((long)pfVar18 + -8) = 0x10418f;
                    bVar6 = xm_get_loop_count(pxVar4);
                    lStack_1a8 = (long)((float)uStack_118 / fStack_13c);
                    uVar15 = (uStack_118 % uStack_1a0) / uStack_190;
                    fVar34 = (float)(long)(uStack_118 % uStack_190) / fStack_138;
                    uVar29 = (ulong)uStack_14c;
                    uVar21 = (ulong)uStack_148;
                    uVar24 = (ulong)uStack_144;
                    uVar31 = (ulong)uStack_140;
                    *(long *)((long)pfVar18 + -0x10) =
                         (long)(((float)(long)(uStack_118 % uStack_158) * 100.0) / fStack_138);
                    *(long *)((long)pfVar18 + -0x18) = (long)fVar34;
                    *(long *)((long)pfVar18 + -0x20) = (long)(float)(long)uVar15;
                    *(long *)((long)pfVar18 + -0x28) = lStack_1a8;
                    uVar15 = uStack_d8;
                    *(ulong *)((long)pfVar18 + -0x30) = uStack_d8;
                    *(ulong *)((long)pfVar18 + -0x38) = (ulong)bVar6;
                    *(ulong *)((long)pfVar18 + -0x40) = (ulong)uVar9;
                    *(ulong *)((long)pfVar18 + -0x48) = uStack_1b0;
                    *(ulong *)((long)pfVar18 + -0x50) = uStack_198;
                    *(undefined8 *)((long)pfVar18 + -0x58) = 0x1042b9;
                    printf("\rSpd[%.2X/%.2X] Pos[%.2X/%.2X] Pat[%.2X/%.2X] Row[%.2X/%.2X] Loop[%.2X/%.2lX] %.2i:%.2i:%.2i.%.2i\r"
                           ,uVar29,uVar21,uVar24,uVar31);
                  }
                  else {
                    *(undefined8 *)((long)pfVar18 + -8) = 0x1041c1;
                    printf("\r%-*s\r",0x46,&fStack_208);
                  }
                  *(undefined8 *)((long)pfVar18 + -8) = 0x1042d3;
                  fflush(_stdout);
                  pxVar4 = pxStack_c0;
                  pfVar25 = pfStack_160;
                  sVar3 = sStack_168;
                  bVar33 = bVar5;
                  if ((uStack_e8 & 1) == 0) {
                    *(undefined8 *)((long)pfVar18 + -8) = 0x1042ff;
                    xm_generate_samples(pxVar4,pfVar25,sVar3);
                    psVar2 = psStack_130;
                    if ((uStack_c8 & 1) != 0) {
                      uStack_c8 = 0;
                      *(undefined8 *)((long)pfVar18 + -8) = 0x10431f;
                      snd_pcm_recover(psVar2,0,0);
                      *(undefined8 *)((long)pfVar18 + -8) = 0x104327;
                      iVar11 = snd_pcm_resume(psVar2);
                      if (iVar11 < 0) {
                        *(undefined8 *)((long)pfVar18 + -8) = 0x104333;
                        iVar11 = snd_pcm_prepare(psVar2);
                        if (iVar11 < 0) {
                          uStack_c8 = 0;
                          *(undefined8 *)((long)pfVar18 + -8) = 0x104353;
                          iVar11 = snd_pcm_recover(psVar2,iVar11,0);
                          if (iVar11 < 0) goto LAB_001044a3;
                        }
                        else {
                          uStack_c8 = 0;
                        }
                      }
                    }
                    fVar34 = fStack_ec;
                    sVar26 = sStack_134;
                    pfVar25 = pfStack_160;
                    sVar3 = sStack_168;
                    alsabuffer = puStack_188;
                    *(undefined8 *)((long)pfVar18 + -8) = 0x104383;
                    play_floatbuffer(psVar2,sVar26,sVar3,fVar34,pfVar25,alsabuffer);
                  }
                  else {
                    *(undefined8 *)((long)pfVar18 + -8) = 0x1042e3;
                    usleep(10000);
                  }
                }
              } while( true );
            }
            *(undefined8 *)((long)pfVar18 + -8) = 0x103d38;
            iVar11 = snd_pcm_recover(psVar2,iVar11,0);
            if (-1 < iVar11) goto LAB_00103d40;
            goto LAB_0010447e;
          }
          *(undefined8 *)((long)pfVar18 + -8) = 0x1043f2;
          main_cold_13();
          goto LAB_001043cd;
        }
LAB_00104417:
        *(undefined8 *)((long)pfVar18 + -8) = 0x104426;
        iVar11 = snd_pcm_close(psStack_170);
        if (-1 < iVar11) {
          return;
        }
        *(undefined8 *)((long)pfVar18 + -8) = 0x104436;
        iVar11 = snd_pcm_recover(psStack_170,iVar11,0);
        if (-1 < iVar11) {
          return;
        }
        goto LAB_001044b1;
      }
    }
  }
LAB_00104490:
  *(undefined8 *)((long)pfVar25 + -8) = 0x104498;
  main_cold_15();
LAB_00104498:
  pfVar18 = pfVar25;
  *(undefined8 *)((long)pfVar18 + -8) = 0x1044a3;
  main_cold_1();
LAB_001044a3:
  *(undefined8 *)((long)pfVar18 + -8) = 0x1044aa;
  main_cold_10();
LAB_001044aa:
  *(undefined8 *)((long)pfVar18 + -8) = 0x1044b1;
  main_cold_9();
LAB_001044b1:
  *(code **)((long)pfVar18 + -8) = restoreterm;
  main_cold_14();
  tcsetattr(0,0,(termios *)&previousflags);
  return;
LAB_00104388:
  uStack_d8 = uVar15;
  *(undefined8 *)((long)pfVar18 + -8) = 0x104396;
  putchar(10);
  psVar2 = psStack_130;
  *(undefined8 *)((long)pfVar18 + -8) = 0x1043a5;
  iVar11 = snd_pcm_drop(psVar2);
  uVar15 = uStack_128;
  if (-1 < iVar11) {
LAB_001043c4:
    pxVar4 = pxStack_c0;
    *(undefined8 *)((long)pfVar18 + -8) = 0x1043cd;
    xm_free_context(pxVar4);
LAB_001043cd:
    uVar15 = uVar15 + 1;
    if (uStack_f8 <= uVar15) goto LAB_00104417;
    goto LAB_00103be5;
  }
  *(undefined8 *)((long)pfVar18 + -8) = 0x1043bc;
  iVar11 = snd_pcm_recover(psVar2,iVar11,0);
  if (-1 < iVar11) goto LAB_001043c4;
LAB_00104477:
  *(undefined8 *)((long)pfVar18 + -8) = 0x10447e;
  main_cold_11();
LAB_0010447e:
  *(undefined8 *)((long)pfVar18 + -8) = 0x104485;
  main_cold_12();
LAB_00104485:
  *(undefined8 *)((long)pfVar18 + -8) = 0x104490;
  main_cold_2();
  pfVar25 = pfVar18;
  goto LAB_00104490;
}

Assistant:

void init_alsa_device(int argc, char** argv,
                      size_t default_period_size,
                      size_t default_buffer_size,
                      int mode,
                      snd_pcm_t** out_device,
		      size_t* out_period_size,
		      unsigned int* out_rate,
                      snd_pcm_format_t* out_format) {
	snd_pcm_t* device;
	void* params;
	char* devicename = "default";
	size_t buffer_size = default_buffer_size;
	size_t period_size = default_period_size;
	const unsigned int channels = 2;
	unsigned int rate = 48000;
	snd_pcm_format_t format = SND_PCM_FORMAT_FLOAT;

	for(size_t i = 1; i < argc; ++i) {
		if(!strcmp(argv[i], "--")) {
			break;
		}

		if(!strcmp(argv[i], "--device")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			devicename = argv[i+1];
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--buffer-size")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			buffer_size = (size_t)strtol(argv[i+1], NULL, 0);
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--period-size")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			period_size = (size_t)strtol(argv[i+1], NULL, 0);
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--rate")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			rate = (unsigned int)strtol(argv[i+1], NULL, 0);
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--format")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			++i;

			if(!strcmp(argv[i], "float")) {
				format = SND_PCM_FORMAT_FLOAT;
				continue;
			}

			if(!strcmp(argv[i], "s16")) {
				format = SND_PCM_FORMAT_S16;
				continue;
			}

			if(!strcmp(argv[i], "s32")) {
				format = SND_PCM_FORMAT_S32;
				continue;
			}

			FATAL("%s: unknown format %s\n", argv[0], argv[i]);
		}

		break;
	}

	CHECK_ALSA_CALL(snd_pcm_open(&device, devicename, SND_PCM_STREAM_PLAYBACK, mode));
	CHECK_ALSA_CALL(snd_pcm_hw_params_malloc((snd_pcm_hw_params_t**)(&params)));
	CHECK_ALSA_CALL(snd_pcm_hw_params_any(device, params));
	CHECK_ALSA_CALL(snd_pcm_hw_params_set_access(device, params, SND_PCM_ACCESS_RW_INTERLEAVED));

	if(snd_pcm_hw_params_set_format(device, params, format) < 0
	   && snd_pcm_hw_params_set_format(device, params, format = SND_PCM_FORMAT_FLOAT) < 0
	   && snd_pcm_hw_params_set_format(device, params, format = SND_PCM_FORMAT_S32) < 0) {
		CHECK_ALSA_CALL(snd_pcm_hw_params_set_format(device, params, format = SND_PCM_FORMAT_S16));
	}

	if(snd_pcm_hw_params_set_rate(device, params, rate, 0) < 0
	   && snd_pcm_hw_params_set_rate(device, params, rate = 48000, 0) < 0) {
		CHECK_ALSA_CALL(snd_pcm_hw_params_set_rate(device, params, rate = 44100, 0));
	}

	CHECK_ALSA_CALL(snd_pcm_hw_params_set_channels(device, params, channels));

	CHECK_ALSA_CALL(snd_pcm_hw_params_set_buffer_size_near(device, params, &buffer_size));
	CHECK_ALSA_CALL(snd_pcm_hw_params_set_period_size_near(device, params, &period_size, 0));
	CHECK_ALSA_CALL(snd_pcm_hw_params(device, params));
	snd_pcm_hw_params_free(params);

	CHECK_ALSA_CALL(snd_pcm_sw_params_malloc((snd_pcm_sw_params_t**)(&params)));
	CHECK_ALSA_CALL(snd_pcm_sw_params_current(device, params));
	CHECK_ALSA_CALL(snd_pcm_sw_params_set_start_threshold(device, params, buffer_size - period_size));
	CHECK_ALSA_CALL(snd_pcm_sw_params_set_avail_min(device, params, period_size));
	CHECK_ALSA_CALL(snd_pcm_sw_params(device, params));
	snd_pcm_sw_params_free(params);

	printf("Opened ALSA device: %s, %s, %i Hz, %lu/%lu\n",
	       devicename,
	       format == SND_PCM_FORMAT_FLOAT ? "float" : (format == SND_PCM_FORMAT_S32 ? "s32" : "s16"),
	       rate,
	       period_size,
	       buffer_size
		);

	*out_device = device;
	*out_period_size = period_size;
	*out_rate = rate;
	*out_format = format;
}